

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<(anonymous_namespace)::QDnsCachedName>::copyAppend
          (QGenericArrayOps<(anonymous_namespace)::QDnsCachedName> *this,QDnsCachedName *b,
          QDnsCachedName *e)

{
  QDnsCachedName *this_00;
  ulong in_RDX;
  ulong in_RSI;
  QDnsCachedName *in_RDI;
  QDnsCachedName *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<(anonymous_namespace)::QDnsCachedName>::begin
                        ((QArrayDataPointer<(anonymous_namespace)::QDnsCachedName> *)0x364693);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      anon_unknown.dwarf_8d754d::QDnsCachedName::QDnsCachedName(this_00,in_RDI);
      local_10 = local_10 + 0x20;
      (in_RDI->name).d.size = (in_RDI->name).d.size + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }